

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall IDLExport::save(IDLExport *this,ostream *stream,RegistryIterator *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  IDLExport *this_00;
  bool bVar5;
  char cVar6;
  int iVar7;
  const_iterator cVar8;
  iterator iVar9;
  UnsupportedType *this_01;
  long *plVar10;
  long lVar11;
  Type *pTVar12;
  ostream *poVar13;
  mapped_type *this_02;
  long *plVar14;
  size_type *psVar15;
  ios_base *this_03;
  bool bVar16;
  string base_name;
  string type_namespace;
  string def;
  ostringstream stream_1;
  string local_408;
  IDLExport *local_3e8;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  long *local_360;
  size_t local_358;
  long local_350;
  long lStack_348;
  long *local_340;
  size_t local_338;
  long local_330;
  long lStack_328;
  long *local_320;
  size_t local_318;
  long local_310;
  long lStack_308;
  long *local_300;
  size_t local_2f8;
  long local_2f0;
  long lStack_2e8;
  undefined1 *local_2e0;
  size_t local_2d8;
  undefined1 local_2d0 [16];
  undefined1 *local_2c0;
  size_t local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  size_t local_298;
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 local_200 [112];
  ios_base local_190 [16];
  ios_base local_180 [264];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
  *local_38;
  
  if ((this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    Typelib::Type::getName_abi_cxx11_();
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->m_selected_types)._M_t,(key_type *)local_200);
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_);
    }
    if ((_Rb_tree_header *)cVar8._M_node ==
        &(this->m_selected_types)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
  }
  bVar5 = Typelib::RegistryIterator::isAlias(type);
  if (!bVar5) {
    if ((this->m_blob_threshold != 0) &&
       (iVar7 = Typelib::Type::getSize(), this->m_blob_threshold < iVar7)) {
      Typelib::getNamespace((string *)&local_3e0);
      anon_unknown.dwarf_196f0::getIDLAbsoluteNamespace((string *)local_200,&local_3e0,this);
      paVar1 = &local_3e0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3e0._M_dataplus._M_p);
      }
      anon_unknown.dwarf_196f0::nameSplit
                ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_3e0,(string *)local_200);
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_3e0);
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct
                ((ulong)&local_3e0,(char)(local_3e0.field_2._M_allocated_capacity << 2));
      adaptNamespace(this,stream,(string *)local_200);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (stream,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"typedef sequence<octet> ",0x18);
      Typelib::Type::getBasename_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3e0._M_dataplus._M_p);
      }
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_);
      }
      return true;
    }
    local_200._0_8_ = &PTR_visit__0011d8a0;
    local_3e8 = this;
    local_200._8_8_ = this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_200 + 0x10));
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_58._M_p = (pointer)&local_48;
    local_38 = &this->m_exported_typedefs;
    Typelib::Type::getNamespace_abi_cxx11_();
    anon_unknown.dwarf_196f0::getIDLAbsoluteNamespace
              (&local_3e0,&local_3a0,(IDLExport *)local_200._8_8_);
    anon_unknown.dwarf_196f0::IDLExportVisitor::setTargetNamespace
              ((IDLExportVisitor *)local_200,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    paVar1 = &local_3a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    Typelib::TypeVisitor::apply((Type *)local_200);
    std::__cxx11::stringbuf::str();
    bVar5 = (IDLExport *)local_3e0._M_string_length != (IDLExport *)0x0;
    if (bVar5) {
      local_3a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a0,local_58._M_p,local_58._M_p + local_50);
      adaptNamespace(local_3e8,stream,&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (stream,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    local_200._0_8_ = &PTR_visit__0011d8a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_200 + 0x10));
    this_03 = local_180;
    goto LAB_0010ec80;
  }
  Typelib::Type::getNamespace_abi_cxx11_();
  Typelib::getNamespace((string *)&local_3e0);
  bVar16 = true;
  bVar5 = true;
  if (local_200._8_8_ == local_3e0._M_string_length) {
    if ((IDLExport *)local_200._8_8_ == (IDLExport *)0x0) {
      bVar5 = false;
    }
    else {
      iVar7 = bcmp((void *)local_200._0_8_,local_3e0._M_dataplus._M_p,local_200._8_8_);
      bVar5 = iVar7 != 0;
    }
  }
  if (bVar5) {
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
  }
  else {
    Typelib::Type::getBasename_abi_cxx11_();
    Typelib::getTypename((string *)local_220);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0x11813d);
    local_360 = &local_350;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_350 = *plVar14;
      lStack_348 = plVar10[3];
    }
    else {
      local_350 = *plVar14;
      local_360 = (long *)*plVar10;
    }
    local_358 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((local_3a0._M_string_length == local_358) &&
       ((local_3a0._M_string_length == 0 ||
        (iVar7 = bcmp(local_3a0._M_dataplus._M_p,local_360,local_3a0._M_string_length), iVar7 == 0))
       )) {
      bVar4 = false;
LAB_0010e823:
      bVar3 = false;
    }
    else {
      Typelib::Type::getBasename_abi_cxx11_();
      Typelib::getTypename((string *)local_240);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_240,0,(char *)0x0,0x118145);
      local_320 = &local_310;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_310 = *plVar14;
        lStack_308 = plVar10[3];
      }
      else {
        local_310 = *plVar14;
        local_320 = (long *)*plVar10;
      }
      local_318 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((local_298 == local_318) &&
         ((bVar4 = true, local_298 == 0 || (iVar7 = bcmp(local_2a0,local_320,local_298), iVar7 == 0)
          ))) goto LAB_0010e823;
      Typelib::getTypename((string *)&local_2c0);
      Typelib::Type::getBasename_abi_cxx11_();
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_260,0,(char *)0x0,0x11813d);
      local_340 = &local_330;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_330 = *plVar14;
        lStack_328 = plVar10[3];
      }
      else {
        local_330 = *plVar14;
        local_340 = (long *)*plVar10;
      }
      local_338 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((local_2b8 != local_338) ||
         ((bVar4 = true, local_2b8 != 0 && (iVar7 = bcmp(local_2c0,local_340,local_2b8), iVar7 != 0)
          ))) {
        Typelib::getTypename((string *)&local_2e0);
        Typelib::Type::getBasename_abi_cxx11_();
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_280,0,(char *)0x0,0x118145);
        local_300 = &local_2f0;
        plVar14 = plVar10 + 2;
        if ((long *)*plVar10 == plVar14) {
          local_2f0 = *plVar14;
          lStack_2e8 = plVar10[3];
        }
        else {
          local_2f0 = *plVar14;
          local_300 = (long *)*plVar10;
        }
        local_2f8 = plVar10[1];
        *plVar10 = (long)plVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        bVar4 = true;
        if (local_2d8 == local_2f8) {
          if (local_2d8 == 0) {
            bVar16 = false;
          }
          else {
            iVar7 = bcmp(local_2e0,local_300,local_2d8);
            bVar16 = iVar7 != 0;
          }
          bVar3 = true;
          bVar2 = true;
        }
        else {
          bVar3 = true;
          bVar2 = true;
          bVar16 = true;
        }
        goto LAB_0010e977;
      }
      bVar3 = true;
    }
    bVar2 = false;
    bVar16 = false;
  }
LAB_0010e977:
  if (bVar2) {
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if (local_280[0] != local_270) {
      operator_delete(local_280[0]);
    }
    if (local_2e0 != local_2d0) {
      operator_delete(local_2e0);
    }
  }
  if (bVar3) {
    if (local_340 != &local_330) {
      operator_delete(local_340);
    }
    if (local_260[0] != local_250) {
      operator_delete(local_260[0]);
    }
    if (local_2c0 != local_2b0) {
      operator_delete(local_2c0);
    }
  }
  if (bVar4) {
    if (local_320 != &local_310) {
      operator_delete(local_320);
    }
    if (local_240[0] != local_230) {
      operator_delete(local_240[0]);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0);
    }
  }
  if (!bVar5) {
    if (local_360 != &local_350) {
      operator_delete(local_360);
    }
    if (local_220[0] != local_210) {
      operator_delete(local_220[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_);
  }
  if (!bVar16) {
    return false;
  }
  checkType(*(Type **)(*(long *)(type + 8) + 0x40));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  Typelib::getNamespace((string *)&local_408);
  anon_unknown.dwarf_196f0::getIDLAbsoluteNamespace(&local_3e0,&local_408,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  lVar11 = *(long *)(*(long *)(type + 8) + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,lVar11,*(long *)(*(long *)(type + 8) + 0x28) + lVar11);
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
          ::find(&(this->m_exported_typedefs)._M_t,&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar9._M_node ==
      &(this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header) {
    Typelib::getTypename((string *)&local_408);
    lVar11 = std::__cxx11::string::find_first_of((char *)&local_408,0x11817e,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (lVar11 != -1) goto LAB_0010ec53;
    Typelib::getTypename((string *)&local_380);
    anon_unknown.dwarf_196f0::stripLeadingUnderscore(&local_408,&local_380);
    paVar1 = &local_380.field_2;
    local_3e8 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    iVar7 = Typelib::Type::getCategory();
    if (iVar7 == 1) {
      lVar11 = __dynamic_cast(*(undefined8 *)(*(long *)(type + 8) + 0x40),&Typelib::Type::typeinfo,
                              &Typelib::Array::typeinfo,0);
      if (lVar11 == 0) {
        __cxa_bad_cast();
      }
      pTVar12 = (Type *)Typelib::Indirect::getIndirection();
      getIDLAbsolute_abi_cxx11_(&local_380,local_3e8,pTVar12);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,local_380._M_dataplus._M_p,
                           local_380._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_408._M_dataplus._M_p,local_408._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"[",1);
      Typelib::Array::getDimension();
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"];",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != paVar1) {
LAB_0010eeec:
        operator_delete(local_380._M_dataplus._M_p);
      }
    }
    else {
      iVar7 = Typelib::Type::getCategory();
      if (iVar7 == 7) {
        Typelib::Type::getName_abi_cxx11_();
        iVar7 = std::__cxx11::string::compare((char *)&local_380);
        bVar5 = iVar7 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != paVar1) {
          operator_delete(local_380._M_dataplus._M_p);
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        lVar11 = __dynamic_cast(*(undefined8 *)(*(long *)(type + 8) + 0x40),&Typelib::Type::typeinfo
                                ,&Typelib::Container::typeinfo,0);
        if (lVar11 == 0) {
          __cxa_bad_cast();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"sequence<",9);
        this_00 = local_3e8;
        pTVar12 = (Type *)Typelib::Indirect::getIndirection();
        getIDLAbsolute_abi_cxx11_(&local_3c0,this_00,pTVar12);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,local_3c0._M_dataplus._M_p,
                             local_3c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"> ",2);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_408._M_dataplus._M_p,local_408._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
        local_380._M_dataplus._M_p = local_3c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) goto LAB_0010eeec;
      }
      else {
        iVar7 = Typelib::Type::getCategory();
        if (iVar7 == 6) {
          if (local_3e8->m_opaque_as_any == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"any ",4);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_200,local_408._M_dataplus._M_p,
                                 local_408._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          }
        }
        else {
          Typelib::getTypename((string *)&local_3c0);
          lVar11 = std::__cxx11::string::find_first_of((char *)&local_3c0,0x1180ea,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if (lVar11 == -1) {
            getIDLAbsolute_abi_cxx11_(&local_3c0,local_3e8,*(Type **)(*(long *)(type + 8) + 0x40));
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_200,local_3c0._M_dataplus._M_p,
                                 local_3c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,local_408._M_dataplus._M_p,local_408._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
            local_380._M_dataplus._M_p = local_3c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) goto LAB_0010eeec;
          }
        }
      }
    }
    std::__cxx11::stringbuf::str();
    if (local_3c0._M_string_length != 0) {
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&local_3e8->m_typedefs,&local_3e0);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_02,&local_3c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    bVar5 = true;
  }
  else {
    cVar6 = Typelib::Type::operator!=
                      (*(Type **)(iVar9._M_node + 2),*(Type **)(*(long *)(type + 8) + 0x40));
    if (cVar6 != '\0') {
      this_01 = (UnsupportedType *)__cxa_allocate_exception(0x38);
      lVar11 = *(long *)(type + 8);
      pTVar12 = *(Type **)(lVar11 + 0x40);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,*(long *)(lVar11 + 0x20),
                 *(long *)(lVar11 + 0x28) + *(long *)(lVar11 + 0x20));
      std::operator+(&local_380,"the typedef name ",&local_3c0);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_380);
      local_408._M_dataplus._M_p = (pointer)*plVar10;
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_408._M_dataplus._M_p == psVar15) {
        local_408.field_2._M_allocated_capacity = *psVar15;
        local_408.field_2._8_8_ = plVar10[3];
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      }
      else {
        local_408.field_2._M_allocated_capacity = *psVar15;
      }
      local_408._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      Typelib::UnsupportedType::UnsupportedType(this_01,pTVar12,&local_408);
      __cxa_throw(this_01,&Typelib::UnsupportedType::typeinfo,
                  Typelib::UnsupportedType::~UnsupportedType);
    }
LAB_0010ec53:
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  this_03 = (ios_base *)(local_200 + 0x70);
LAB_0010ec80:
  std::ios_base::~ios_base(this_03);
  return bVar5;
}

Assistant:

bool IDLExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (! m_selected_types.empty())
    {
        if (m_selected_types.count(type->getName()) == 0)
        {
            return false;
        }
    }

    if (type.isAlias())
    {
        // IDL has C++-like rules for struct and enums. Do not alias a "struct A" to "A";
        if (type->getNamespace() != type.getNamespace()
                || (type->getBasename() != "struct " + type.getBasename()
                    && type->getBasename() != "enum " + type.getBasename()
                    && type.getBasename() != "struct " + type->getBasename()
                    && type.getBasename() != "enum " + type->getBasename()))
        {
            IDLExport::checkType(*type);
            ostringstream stream;

            std::string type_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);

            map<string, Type const*>::const_iterator already_exported =
                m_exported_typedefs.find(type.getName());
            if (already_exported != m_exported_typedefs.end())
            {
                if (*already_exported->second != *type)
                    throw UnsupportedType(*type, "the typedef name " + type.getName() + " is reserved by the IDL exporter");
                return false;
            }
            else if (type.getBasename().find_first_of("/<>") != std::string::npos)
            {
                return false;
            }

            std::string base_name = stripLeadingUnderscore(type.getBasename());

            // Alias types using typedef, taking into account that the aliased type
            // may not be in the same module than the new alias.
            if (type->getCategory() == Type::Array)
            {
                Array const& array_t = dynamic_cast<Array const&>(*type);
                stream
                    << getIDLAbsolute(array_t.getIndirection())
                    << " " << base_name << "[" << array_t.getDimension() << "];";
            }
            else if (type->getCategory() == Type::Container && type->getName() != "/std/string")
            {
                // Generate a sequence, regardless of the actual container type
                Container const& container_t = dynamic_cast<Container const&>(*type);
                stream << "sequence<" << getIDLAbsolute(container_t.getIndirection()) << "> " << base_name << ";";
            }
            else if (type->getCategory() == Type::Opaque)
            {
                if (marshalOpaquesAsAny())
                    stream << "any " << base_name << ";";
            }
            else if (type.getBasename().find_first_of(" ") == string::npos)
                stream << getIDLAbsolute(*type) << " " << base_name << ";";

            std::string def = stream.str();
            if (!def.empty())
                m_typedefs[type_namespace].push_back(def);
            return true;
        }
        else return false;
    }
    else
    {
        // Don't call adaptNamespace right now, since some types can be simply
        // ignored by the IDLExportVisitor -- resulting in an empty module,
        // which is not accepted in IDL
        //
        // Instead, act "as if" the namespace was changed, capturing the output
        // in a temporary ostringstream and change namespace only if some output
        // has actually been generated

        if (m_blob_threshold && static_cast<int>(type->getSize()) > m_blob_threshold)
        {
            string target_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);
            size_t ns_size = namespaceIndentLevel(target_namespace);
            string indent_string = string(ns_size * 4, ' ');

            adaptNamespace(stream, target_namespace);
            stream << indent_string << "typedef sequence<octet> " << type->getBasename() << ";\n";
            return true;
        }
        else
        {
            IDLExportVisitor exporter(type.getRegistry(), *this, m_exported_typedefs);
            exporter.apply(*type);

            string result = exporter.getResult();
            if (result.empty())
                return false;
            else
            {
                adaptNamespace(stream, exporter.getTargetNamespace());
                stream << result;
                return true;
            }
        }
    }
}